

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeMergeEngineInit(SortSubtask *pTask,MergeEngine *pMerger,int eMode)

{
  PmaReader *pPVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int local_3c;
  SortSubtask *local_38;
  
  pMerger->pTask = pTask;
  iVar7 = pMerger->nTree;
  lVar4 = (long)iVar7;
  if (0 < lVar4) {
    lVar6 = 0;
    do {
      iVar7 = iVar7 + -1;
      if (eMode == 2) {
        iVar2 = vdbePmaReaderNext(pMerger->aReadr + iVar7);
      }
      else {
        iVar2 = vdbePmaReaderIncrInit((PmaReader *)((long)&pMerger->aReadr->iReadOff + lVar6),0);
      }
      if (iVar2 != 0) {
        return iVar2;
      }
      lVar6 = lVar6 + 0x50;
    } while (lVar4 * 0x50 != lVar6);
  }
  iVar7 = pMerger->nTree;
  local_38 = pTask;
  if (1 < (long)iVar7) {
    iVar2 = iVar7 * 2;
    lVar4 = (long)iVar7 + 1;
    do {
      iVar2 = iVar2 + -2;
      lVar6 = lVar4 + -1;
      iVar7 = pMerger->nTree / 2;
      if (iVar7 < lVar6) {
        iVar8 = iVar2 + iVar7 * -2;
        iVar7 = iVar8 + 1;
      }
      else {
        iVar8 = pMerger->aTree[lVar4 * 2 + -4];
        iVar7 = pMerger->aTree[lVar4 * 2 + -3];
      }
      pPVar1 = pMerger->aReadr;
      iVar5 = iVar7;
      if ((pPVar1[iVar8].pFd != (sqlite3_file *)0x0) &&
         (iVar5 = iVar8, pPVar1[iVar7].pFd != (sqlite3_file *)0x0)) {
        local_3c = 0;
        iVar3 = (*pMerger->pTask->xCompare)
                          (pMerger->pTask,&local_3c,pPVar1[iVar8].aKey,pPVar1[iVar8].nKey,
                           pPVar1[iVar7].aKey,pPVar1[iVar7].nKey);
        iVar5 = iVar7;
        if (iVar3 < 1) {
          iVar5 = iVar8;
        }
      }
      pMerger->aTree[lVar4 + -2] = iVar5;
      lVar4 = lVar6;
    } while (2 < lVar6);
  }
  return (uint)local_38->pUnpacked->errCode;
}

Assistant:

static int vdbeMergeEngineInit(
  SortSubtask *pTask,             /* Thread that will run pMerger */
  MergeEngine *pMerger,           /* MergeEngine to initialize */
  int eMode                       /* One of the INCRINIT_XXX constants */
){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* For looping over PmaReader objects */
  int nTree;                      /* Number of subtrees to merge */

  /* Failure to allocate the merge would have been detected prior to
  ** invoking this routine */
  assert( pMerger!=0 );

  /* eMode is always INCRINIT_NORMAL in single-threaded mode */
  assert( SQLITE_MAX_WORKER_THREADS>0 || eMode==INCRINIT_NORMAL );

  /* Verify that the MergeEngine is assigned to a single thread */
  assert( pMerger->pTask==0 );
  pMerger->pTask = pTask;

  nTree = pMerger->nTree;
  for(i=0; i<nTree; i++){
    if( SQLITE_MAX_WORKER_THREADS>0 && eMode==INCRINIT_ROOT ){
      /* PmaReaders should be normally initialized in order, as if they are
      ** reading from the same temp file this makes for more linear file IO.
      ** However, in the INCRINIT_ROOT case, if PmaReader aReadr[nTask-1] is
      ** in use it will block the vdbePmaReaderNext() call while it uses
      ** the main thread to fill its buffer. So calling PmaReaderNext()
      ** on this PmaReader before any of the multi-threaded PmaReaders takes
      ** better advantage of multi-processor hardware. */
      rc = vdbePmaReaderNext(&pMerger->aReadr[nTree-i-1]);
    }else{
      rc = vdbePmaReaderIncrInit(&pMerger->aReadr[i], INCRINIT_NORMAL);
    }
    if( rc!=SQLITE_OK ) return rc;
  }

  for(i=pMerger->nTree-1; i>0; i--){
    vdbeMergeEngineCompare(pMerger, i);
  }
  return pTask->pUnpacked->errCode;
}